

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  bool bVar18;
  size_t sStack_50;
  char buffer [8];
  
  if (hbSize < 8) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    memcpy(buffer,headerBuffer,hbSize);
    sVar4 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,buffer,8);
    sStack_50 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sStack_50 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sStack_50 = sVar4;
    }
  }
  else {
    uVar8 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar8 * 2);
    uVar2 = *headerBuffer & 0xf;
    if (uVar2 < 0xb) {
      uVar14 = *headerBuffer >> 4;
      *tableLogPtr = uVar2 + 5;
      iVar13 = 0x20 << (sbyte)uVar2;
      uVar11 = iVar13 + 1;
      iVar3 = uVar2 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar17 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar18 = true;
      uVar2 = 4;
      uVar16 = 0;
      puVar12 = (uint *)headerBuffer;
      do {
        uVar9 = uVar16;
        if (!bVar18) {
          while( true ) {
            uVar5 = 0;
            if ((~uVar14 | 0x80000000) != 0) {
              for (; ((~uVar14 | 0x80000000) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (uVar5 < 0x18) break;
            if (puVar1 < puVar12) {
              uVar2 = uVar2 + ((int)puVar12 - (int)puVar1) * 8 & 0x1f;
              puVar12 = puVar17;
            }
            else {
              puVar12 = (uint *)((long)puVar12 + 3);
            }
            uVar14 = *puVar12 >> (sbyte)uVar2;
            uVar9 = uVar9 + 0x24;
          }
          uVar15 = uVar14 >> ((byte)(uVar5 & 0xfffffffe) & 0x1f) & 3;
          uVar16 = (uVar5 >> 1) * 3 + uVar9 + uVar15;
          uVar14 = uVar2 + (uVar5 & 0xfffffffe) + 2;
          if (uVar8 <= uVar16) {
            uVar16 = uVar15 + (uVar5 >> 1) * 3 + uVar9;
LAB_0053c02e:
            if (uVar11 != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar8 < uVar16) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)uVar14) {
              return 0xffffffffffffffec;
            }
            *maxSVPtr = uVar16 - 1;
            return (long)puVar12 + ((long)((int)(uVar14 + 7) >> 3) - (long)headerBuffer);
          }
          if ((puVar1 < puVar12) && (puVar17 < (uint *)((long)puVar12 + (ulong)(uVar14 >> 3)))) {
            uVar2 = uVar14 + ((int)puVar12 - (int)puVar17) * 8 & 0x1f;
            puVar12 = puVar17;
          }
          else {
            uVar2 = uVar14 & 7;
            puVar12 = (uint *)((long)puVar12 + (ulong)(uVar14 >> 3));
          }
          uVar14 = *puVar12 >> (sbyte)uVar2;
        }
        uVar9 = iVar13 * 2 - 1;
        uVar15 = uVar9 - uVar11;
        uVar5 = iVar13 - 1U & uVar14;
        if (uVar5 < uVar15) {
          iVar10 = iVar3 + -1;
        }
        else {
          uVar14 = uVar14 & uVar9;
          if ((int)uVar14 < iVar13) {
            uVar15 = 0;
          }
          uVar5 = uVar14 - uVar15;
          iVar10 = iVar3;
        }
        uVar14 = iVar10 + uVar2;
        iVar10 = uVar5 - 1;
        iVar7 = 1 - uVar5;
        if ((int)uVar5 < 1) {
          iVar7 = iVar10;
        }
        uVar11 = uVar11 + iVar7;
        uVar6 = (ulong)uVar16;
        uVar16 = uVar16 + 1;
        normalizedCounter[uVar6] = (short)iVar10;
        bVar18 = iVar10 != 0;
        if ((int)uVar11 < iVar13) {
          if ((int)uVar11 < 2) goto LAB_0053c02e;
          uVar2 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          iVar3 = (uVar2 ^ 0xffffffe0) + 0x21;
          iVar13 = 1 << ((byte)uVar2 & 0x1f);
        }
        if (uVar8 <= uVar16) goto LAB_0053c02e;
        if ((puVar1 < puVar12) && (puVar17 < (uint *)((long)puVar12 + (long)((int)uVar14 >> 3)))) {
          uVar2 = uVar14 + ((int)puVar12 - (int)puVar17) * 8 & 0x1f;
          puVar12 = puVar17;
        }
        else {
          uVar2 = uVar14 & 7;
          puVar12 = (uint *)((long)puVar12 + (long)((int)uVar14 >> 3));
        }
        uVar14 = *puVar12 >> (sbyte)uVar2;
      } while( true );
    }
    sStack_50 = 0xffffffffffffffd4;
  }
  return sStack_50;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}